

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRegion __thiscall
QGraphicsItem::boundingRegion(QGraphicsItem *this,QTransform *itemToDeviceTransform)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  QRect *this_00;
  QRectF *in_RDX;
  long *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  qreal qVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  QRect *rect;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  int pad;
  qreal granularity;
  QRegion *r;
  QRect xrect;
  QBitmap colorMask;
  QPointF offset;
  QPointF viewOrigo;
  QPainter p;
  QImage mask;
  QSize bitmapSize;
  QRect deviceRect;
  QStyleOptionGraphicsItem option;
  QTransform unscale;
  int in_stack_fffffffffffffce8;
  RenderHint in_stack_fffffffffffffcec;
  undefined4 in_stack_fffffffffffffcf0;
  QRectF *p1;
  QGraphicsItem *this_01;
  QRectF *this_02;
  QRect *p_00;
  QRect *local_2d0;
  QRect local_298;
  undefined1 local_288 [16];
  QPoint local_270;
  QPoint local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  QRegion local_240 [2];
  QImage local_230 [24];
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  QPointF local_200;
  undefined8 local_1f0;
  undefined8 local_1e8;
  QPoint local_1e0;
  QPointF local_1c8;
  QPointF local_1b8;
  undefined8 local_1a8;
  undefined8 local_1a0;
  bool local_194;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  int local_170 [3];
  int local_164;
  undefined1 *local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [96];
  undefined1 local_a8 [80];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  qVar4 = boundingRegionGranularity(in_RDI);
  local_118._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_118._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_02 = in_RDX;
  (**(code **)(*in_RSI + 0x18))(local_158);
  QTransform::mapRect((QRectF *)local_138);
  local_118 = (undefined1  [16])QRectF::toRect(this_02);
  _q_adjustRect((QRect *)0x981bfc);
  if ((qVar4 != 0.0) || (NAN(qVar4))) {
    local_160 = &DAT_aaaaaaaaaaaaaaaa;
    local_164 = 1;
    iVar1 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_170[2] = (int)((double)iVar1 * qVar4) + 2;
    piVar3 = qMax<int>(&local_164,local_170 + 2);
    iVar1 = *piVar3;
    local_170[1] = 1;
    iVar2 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_170[0] = (int)((double)iVar2 * qVar4) + 2;
    qMax<int>(local_170 + 1,local_170);
    QSize::QSize((QSize *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),in_stack_fffffffffffffcec,
                 in_stack_fffffffffffffce8);
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    local_178 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_188,(QSize *)&local_160,Format_ARGB32_Premultiplied);
    QImage::fill((uint)&local_188);
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_190,(QPaintDevice *)&local_188);
    QFlags<QPainter::RenderHint>::QFlags
              ((QFlags<QPainter::RenderHint> *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffcec);
    QPainter::setRenderHints((QFlags_conflict1 *)&local_190,local_194);
    local_1a8 = 0xffffffffffffffff;
    local_1a0 = 0xffffffffffffffff;
    uVar5 = 0;
    p1 = in_RDX;
    QPointF::QPointF(&local_1b8,0.0,0.0);
    local_1a8 = QTransform::map((QPointF *)p1);
    local_1c8.yp = -NAN;
    local_1c8.xp = -NAN;
    local_1a0 = uVar5;
    local_1e0 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8
                                                ));
    QPointF::QPointF((QPointF *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
                     (QPoint *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    local_1c8 = ::operator-((QPointF *)p1,(QPointF *)CONCAT44(iVar1,in_stack_fffffffffffffcf0));
    QPainter::scale(qVar4,qVar4);
    QPainter::translate((QPointF *)&local_190);
    QPainter::translate((QPainter *)this_01,(qreal)in_RDI,(qreal)p1);
    QPainter::setWorldTransform((QTransform *)&local_190,SUB81(in_RDX,0));
    QTransform::inverted((bool *)local_58);
    uVar5 = 0;
    QPointF::QPointF(&local_200,0.0,0.0);
    local_1f0 = QTransform::map((QPointF *)local_58);
    local_1e8 = uVar5;
    QPainter::translate((QPointF *)&local_190);
    memcpy(local_108,&DAT_00b420b0,0x60);
    QStyleOptionGraphicsItem::QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)0x981f46);
    (**(code **)(*in_RSI + 0x50))(in_RSI,&local_190,local_108,0);
    QPainter::end();
    memcpy(local_a8,&DAT_00b42110,0x50);
    QTransform::fromScale(1.0 / qVar4,1.0 / qVar4);
    in_RDI->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)in_RDI);
    local_218 = &DAT_aaaaaaaaaaaaaaaa;
    local_210 = &DAT_aaaaaaaaaaaaaaaa;
    local_208 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::createMaskFromColor(local_230,&local_188,0);
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffcec);
    QBitmap::fromImage((QImage *)&local_218,(QFlags_conflict1 *)local_230);
    QImage::~QImage(local_230);
    QRegion::QRegion(local_240,(QBitmap *)&local_218);
    local_2d0 = (QRect *)QRegion::begin();
    this_00 = (QRect *)QRegion::end();
    for (; local_2d0 != this_00; local_2d0 = local_2d0 + 1) {
      local_250._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_250._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      p_00 = local_2d0;
      auVar6 = QTransform::mapRect((QRect *)local_a8);
      local_260 = auVar6;
      local_270 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffcec,
                                                   in_stack_fffffffffffffce8));
      QPoint::QPoint((QPoint *)CONCAT44(iVar1,in_stack_fffffffffffffcf0),in_stack_fffffffffffffcec,
                     in_stack_fffffffffffffce8);
      local_268 = ::operator-((QPoint *)in_RDI,(QPoint *)p1);
      local_250 = (undefined1  [16])QRect::translated(this_00,(QPoint *)p_00);
      local_298 = QRect::adjusted(this_00,(int)((ulong)p_00 >> 0x20),(int)p_00,
                                  (int)((ulong)this_02 >> 0x20),(int)this_02);
      auVar6 = QRect::operator&(&local_298,(QRect *)local_118);
      local_288 = auVar6;
      QRegion::operator+=((QRegion *)in_RDI,(QRect *)local_288);
    }
    QRegion::~QRegion(local_240);
    QBitmap::~QBitmap((QBitmap *)&local_218);
    QStyleOptionGraphicsItem::~QStyleOptionGraphicsItem((QStyleOptionGraphicsItem *)0x982222);
    QPainter::~QPainter((QPainter *)&local_190);
    QImage::~QImage((QImage *)&local_188);
  }
  else {
    QRegion::QRegion((QRegion *)in_RDI,(QRect *)local_118,Rectangle);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QRegion)(QRegionData *)this_01;
}

Assistant:

QRegion QGraphicsItem::boundingRegion(const QTransform &itemToDeviceTransform) const
{
    // ### Ideally we would have a better way to generate this region,
    // preferably something in the lines of QPainterPath::toRegion(QTransform)
    // coupled with a way to generate a painter path from a set of painter
    // operations (e.g., QPicture::toPainterPath() or so). The current
    // approach generates a bitmap with the size of the item's bounding rect
    // in device coordinates, scaled by b.r.granularity, then paints the item
    // into the bitmap, converts the result to a QRegion and scales the region
    // back to device space with inverse granularity.
    qreal granularity = boundingRegionGranularity();
    QRect deviceRect = itemToDeviceTransform.mapRect(boundingRect()).toRect();
    _q_adjustRect(&deviceRect);
    if (granularity == 0.0)
        return QRegion(deviceRect);

    int pad = 1;
    QSize bitmapSize(qMax(1, int(deviceRect.width() * granularity) + pad * 2),
                     qMax(1, int(deviceRect.height() * granularity) + pad * 2));
    QImage mask(bitmapSize, QImage::Format_ARGB32_Premultiplied);
    mask.fill(0);
    QPainter p(&mask);
    p.setRenderHints(QPainter::Antialiasing);

    // Transform painter (### this code is from QGraphicsScene::drawItemHelper
    // and doesn't work properly with perspective transformations).
    QPointF viewOrigo = itemToDeviceTransform.map(QPointF(0,  0));
    QPointF offset = viewOrigo - deviceRect.topLeft();
    p.scale(granularity, granularity);
    p.translate(offset);
    p.translate(pad, pad);
    p.setWorldTransform(itemToDeviceTransform, true);
    p.translate(itemToDeviceTransform.inverted().map(QPointF(0, 0)));

    // Render
    QStyleOptionGraphicsItem option;
    const_cast<QGraphicsItem *>(this)->paint(&p, &option, nullptr);
    p.end();

    // Transform QRegion back to device space
    QTransform unscale = QTransform::fromScale(1 / granularity, 1 / granularity);
    QRegion r;
    QBitmap colorMask = QBitmap::fromImage(mask.createMaskFromColor(0));
    for (const QRect &rect : QRegion(colorMask)) {
        QRect xrect = unscale.mapRect(rect).translated(deviceRect.topLeft() - QPoint(pad, pad));
        r += xrect.adjusted(-1, -1, 1, 1) & deviceRect;
    }
    return r;
}